

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawIndirectTest.cpp
# Opt level: O3

int __thiscall vkt::Draw::IndirectDrawTests::init(IndirectDrawTests *this,EVP_PKEY_CTX *ctx)

{
  TestContext *pTVar1;
  TestNode *pTVar2;
  _Alloc_hider name;
  undefined8 in_RAX;
  long *plVar3;
  TestNode *pTVar4;
  mapped_type *ppcVar5;
  InstanceFactory<vkt::Draw::(anonymous_namespace)::IndirectDraw> *pIVar6;
  TestNode *this_00;
  InstanceFactory<vkt::Draw::(anonymous_namespace)::IndirectDrawInstanced<vkt::Draw::(anonymous_namespace)::FirtsInstanceNotSupported>_>
  *pIVar7;
  InstanceFactory<vkt::Draw::(anonymous_namespace)::IndirectDrawInstanced<vkt::Draw::(anonymous_namespace)::FirtsInstanceSupported>_>
  *pIVar8;
  undefined8 uVar9;
  char *pcVar10;
  long *plVar11;
  TestSpec testSpec;
  string drawTypeStr;
  undefined1 local_240 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_220;
  undefined1 local_210 [24];
  _Rb_tree_node_base local_1f8;
  undefined8 local_1d8;
  VkPrimitiveTopology local_1d0;
  int iStack_1cc;
  int local_1c4;
  TestNode *local_1c0;
  TestNode *local_1b8;
  TestNode *local_1b0;
  uint local_1a4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  TestSpec local_180;
  TestSpec local_148;
  TestSpec local_110;
  TestSpec local_d8;
  TestSpec local_a0;
  TestSpec local_68;
  
  uVar9 = CONCAT71((int7)((ulong)in_RAX >> 8),1);
  local_1c4 = 0;
  local_1c0 = (TestNode *)this;
  do {
    local_1a4 = (uint)uVar9;
    local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
    local_1a0._M_string_length = 0;
    local_1a0.field_2._M_local_buf[0] = '\0';
    pcVar10 = "sequential";
    if (local_1c4 != 0) {
      pcVar10 = "indexed";
    }
    std::__cxx11::string::_M_replace((ulong)&local_1a0,0,(char *)0x0,(ulong)pcVar10);
    local_1b8 = (TestNode *)operator_new(0x70);
    name._M_p = local_1a0._M_dataplus._M_p;
    pTVar1 = ((TestNode *)this)->m_testCtx;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_240,
                   "Draws geometry using ",&local_1a0);
    plVar3 = (long *)std::__cxx11::string::append((char *)local_240);
    plVar11 = plVar3 + 2;
    if ((_Base_ptr *)*plVar3 == (_Base_ptr *)plVar11) {
      local_1f8._M_parent = (_Base_ptr)*plVar11;
      local_1f8._M_left = (_Base_ptr)plVar3[3];
      local_210._16_8_ = &local_1f8._M_parent;
    }
    else {
      local_1f8._M_parent = (_Base_ptr)*plVar11;
      local_210._16_8_ = (_Base_ptr *)*plVar3;
    }
    local_1f8._0_8_ = plVar3[1];
    *plVar3 = (long)plVar11;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)local_1b8,pTVar1,name._M_p,(char *)local_210._16_8_);
    if ((_Base_ptr *)local_210._16_8_ != &local_1f8._M_parent) {
      operator_delete((void *)local_210._16_8_,(ulong)((long)&(local_1f8._M_parent)->_M_color + 1));
    }
    if ((string *)local_240._0_8_ != (string *)(local_240 + 0x10)) {
      operator_delete((void *)local_240._0_8_,local_240._16_8_ + 1);
    }
    pTVar4 = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar4,((TestNode *)this)->m_testCtx,"indirect_draw",
               "Draws geometry");
    local_1f8._0_8_ = local_1f8._0_8_ & 0xffffffff00000000;
    local_1f8._M_parent = (_Base_ptr)0x0;
    local_1f8._M_left = &local_1f8;
    local_1d8 = 0;
    iStack_1cc = local_1c4;
    local_240._0_8_ = local_240._0_8_ & 0xffffffff00000000;
    local_1f8._M_right = local_1f8._M_left;
    ppcVar5 = std::
              map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
              ::operator[]((map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
                            *)(local_210 + 0x10),(key_type *)local_240);
    *ppcVar5 = "vulkan/draw/VertexFetch.vert";
    local_240._0_4_ = 1;
    ppcVar5 = std::
              map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
              ::operator[]((map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
                            *)(local_210 + 0x10),(key_type *)local_240);
    *ppcVar5 = "vulkan/draw/VertexFetch.frag";
    local_1d0 = VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST;
    pIVar6 = (InstanceFactory<vkt::Draw::(anonymous_namespace)::IndirectDraw> *)operator_new(0xa8);
    pTVar1 = ((TestNode *)this)->m_testCtx;
    local_240._0_8_ = local_240 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_240,"triangle_list","");
    local_220._M_allocated_capacity = (size_type)local_210;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"Draws triangle list","");
    std::
    _Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
    ::_Rb_tree((_Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
                *)&local_68,
               (_Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
                *)(local_210 + 0x10));
    local_68.super_TestSpecBase._52_4_ = iStack_1cc;
    local_68.super_TestSpecBase.topology = local_1d0;
    InstanceFactory<vkt::Draw::(anonymous_namespace)::IndirectDraw>::InstanceFactory
              (pIVar6,pTVar1,(string *)local_240._0_8_,(string *)local_220._M_allocated_capacity,
               &local_68);
    tcu::TestNode::addChild(pTVar4,(TestNode *)pIVar6);
    std::
    _Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
    ::~_Rb_tree((_Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
                 *)&local_68);
    pTVar2 = local_1c0;
    if ((string *)local_220._M_allocated_capacity != (string *)local_210) {
      operator_delete((void *)local_220._M_allocated_capacity,(ulong)(local_210._0_8_ + 1));
    }
    if ((string *)local_240._0_8_ != (string *)(local_240 + 0x10)) {
      operator_delete((void *)local_240._0_8_,local_240._16_8_ + 1);
    }
    local_1d0 = VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP;
    pIVar6 = (InstanceFactory<vkt::Draw::(anonymous_namespace)::IndirectDraw> *)operator_new(0xa8);
    pTVar1 = pTVar2->m_testCtx;
    local_240._0_8_ = local_240 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_240,"triangle_strip","");
    local_220._M_allocated_capacity = (size_type)local_210;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"Draws triangle strip","");
    std::
    _Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
    ::_Rb_tree((_Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
                *)&local_180,
               (_Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
                *)(local_210 + 0x10));
    local_180.super_TestSpecBase._52_4_ = iStack_1cc;
    local_180.super_TestSpecBase.topology = local_1d0;
    InstanceFactory<vkt::Draw::(anonymous_namespace)::IndirectDraw>::InstanceFactory
              (pIVar6,pTVar1,(string *)local_240._0_8_,(string *)local_220._M_allocated_capacity,
               &local_180);
    tcu::TestNode::addChild(pTVar4,(TestNode *)pIVar6);
    std::
    _Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
    ::~_Rb_tree((_Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
                 *)&local_180);
    pTVar2 = local_1c0;
    if ((string *)local_220._M_allocated_capacity != (string *)local_210) {
      operator_delete((void *)local_220._M_allocated_capacity,(ulong)(local_210._0_8_ + 1));
    }
    if ((string *)local_240._0_8_ != (string *)(local_240 + 0x10)) {
      operator_delete((void *)local_240._0_8_,local_240._16_8_ + 1);
    }
    std::
    _Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
    ::~_Rb_tree((_Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
                 *)(local_210 + 0x10));
    tcu::TestNode::addChild(local_1b8,pTVar4);
    pTVar4 = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar4,pTVar2->m_testCtx,"indirect_draw_instanced",
               "Draws an instanced geometry");
    this_00 = (TestNode *)operator_new(0x70);
    local_1b0 = pTVar4;
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)this_00,pTVar2->m_testCtx,"no_first_instance",
               "Use 0 as firstInstance");
    local_1f8._0_8_ = local_1f8._0_8_ & 0xffffffff00000000;
    local_1f8._M_parent = (_Base_ptr)0x0;
    local_1f8._M_left = &local_1f8;
    local_1d8 = 0;
    iStack_1cc = local_1c4;
    local_240._0_8_ = local_240._0_8_ & 0xffffffff00000000;
    local_1f8._M_right = local_1f8._M_left;
    ppcVar5 = std::
              map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
              ::operator[]((map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
                            *)(local_210 + 0x10),(key_type *)local_240);
    *ppcVar5 = "vulkan/draw/VertexFetchInstanced.vert";
    local_240._0_4_ = 1;
    ppcVar5 = std::
              map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
              ::operator[]((map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
                            *)(local_210 + 0x10),(key_type *)local_240);
    *ppcVar5 = "vulkan/draw/VertexFetch.frag";
    local_1d0 = VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST;
    pIVar7 = (InstanceFactory<vkt::Draw::(anonymous_namespace)::IndirectDrawInstanced<vkt::Draw::(anonymous_namespace)::FirtsInstanceNotSupported>_>
              *)operator_new(0xa8);
    pTVar1 = pTVar2->m_testCtx;
    local_240._0_8_ = local_240 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_240,"triangle_list","");
    local_220._M_allocated_capacity = (size_type)local_210;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_220,"Draws an instanced triangle list","");
    std::
    _Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
    ::_Rb_tree((_Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
                *)&local_a0,
               (_Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
                *)(local_210 + 0x10));
    local_a0.super_TestSpecBase._52_4_ = iStack_1cc;
    local_a0.super_TestSpecBase.topology = local_1d0;
    InstanceFactory<vkt::Draw::(anonymous_namespace)::IndirectDrawInstanced<vkt::Draw::(anonymous_namespace)::FirtsInstanceNotSupported>_>
    ::InstanceFactory(pIVar7,pTVar1,(string *)local_240._0_8_,
                      (string *)local_220._M_allocated_capacity,&local_a0);
    tcu::TestNode::addChild(this_00,(TestNode *)pIVar7);
    std::
    _Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
    ::~_Rb_tree((_Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
                 *)&local_a0);
    pTVar2 = local_1c0;
    if ((string *)local_220._M_allocated_capacity != (string *)local_210) {
      operator_delete((void *)local_220._M_allocated_capacity,(ulong)(local_210._0_8_ + 1));
    }
    if ((string *)local_240._0_8_ != (string *)(local_240 + 0x10)) {
      operator_delete((void *)local_240._0_8_,local_240._16_8_ + 1);
    }
    local_1d0 = VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP;
    pIVar7 = (InstanceFactory<vkt::Draw::(anonymous_namespace)::IndirectDrawInstanced<vkt::Draw::(anonymous_namespace)::FirtsInstanceNotSupported>_>
              *)operator_new(0xa8);
    pTVar1 = pTVar2->m_testCtx;
    local_240._0_8_ = local_240 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_240,"triangle_strip","");
    local_220._M_allocated_capacity = (size_type)local_210;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_220,"Draws an instanced triangle strip","");
    std::
    _Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
    ::_Rb_tree((_Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
                *)&local_d8,
               (_Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
                *)(local_210 + 0x10));
    local_d8.super_TestSpecBase._52_4_ = iStack_1cc;
    local_d8.super_TestSpecBase.topology = local_1d0;
    InstanceFactory<vkt::Draw::(anonymous_namespace)::IndirectDrawInstanced<vkt::Draw::(anonymous_namespace)::FirtsInstanceNotSupported>_>
    ::InstanceFactory(pIVar7,pTVar1,(string *)local_240._0_8_,
                      (string *)local_220._M_allocated_capacity,&local_d8);
    tcu::TestNode::addChild(this_00,(TestNode *)pIVar7);
    std::
    _Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
    ::~_Rb_tree((_Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
                 *)&local_d8);
    pTVar2 = local_1c0;
    if ((string *)local_220._M_allocated_capacity != (string *)local_210) {
      operator_delete((void *)local_220._M_allocated_capacity,(ulong)(local_210._0_8_ + 1));
    }
    pTVar4 = local_1b0;
    if ((string *)local_240._0_8_ != (string *)(local_240 + 0x10)) {
      operator_delete((void *)local_240._0_8_,local_240._16_8_ + 1);
    }
    std::
    _Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
    ::~_Rb_tree((_Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
                 *)(local_210 + 0x10));
    tcu::TestNode::addChild(pTVar4,this_00);
    pTVar4 = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar4,pTVar2->m_testCtx,"first_instance",
               "Use drawIndirectFirstInstance optional feature");
    local_1f8._0_8_ = local_1f8._0_8_ & 0xffffffff00000000;
    local_1f8._M_parent = (_Base_ptr)0x0;
    local_1f8._M_left = &local_1f8;
    local_1d8 = 0;
    iStack_1cc = local_1c4;
    local_240._0_8_ = local_240._0_8_ & 0xffffffff00000000;
    local_1f8._M_right = local_1f8._M_left;
    ppcVar5 = std::
              map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
              ::operator[]((map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
                            *)(local_210 + 0x10),(key_type *)local_240);
    *ppcVar5 = "vulkan/draw/VertexFetchInstancedFirstInstance.vert";
    local_240._0_4_ = 1;
    ppcVar5 = std::
              map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
              ::operator[]((map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
                            *)(local_210 + 0x10),(key_type *)local_240);
    *ppcVar5 = "vulkan/draw/VertexFetch.frag";
    local_1d0 = VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST;
    pIVar8 = (InstanceFactory<vkt::Draw::(anonymous_namespace)::IndirectDrawInstanced<vkt::Draw::(anonymous_namespace)::FirtsInstanceSupported>_>
              *)operator_new(0xa8);
    pTVar1 = pTVar2->m_testCtx;
    local_240._0_8_ = local_240 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_240,"triangle_list","");
    local_220._M_allocated_capacity = (size_type)local_210;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_220,"Draws an instanced triangle list","");
    std::
    _Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
    ::_Rb_tree((_Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
                *)&local_110,
               (_Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
                *)(local_210 + 0x10));
    local_110.super_TestSpecBase._52_4_ = iStack_1cc;
    local_110.super_TestSpecBase.topology = local_1d0;
    InstanceFactory<vkt::Draw::(anonymous_namespace)::IndirectDrawInstanced<vkt::Draw::(anonymous_namespace)::FirtsInstanceSupported>_>
    ::InstanceFactory(pIVar8,pTVar1,(string *)local_240._0_8_,
                      (string *)local_220._M_allocated_capacity,&local_110);
    tcu::TestNode::addChild(pTVar4,(TestNode *)pIVar8);
    std::
    _Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
    ::~_Rb_tree((_Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
                 *)&local_110);
    pTVar2 = local_1c0;
    if ((string *)local_220._M_allocated_capacity != (string *)local_210) {
      operator_delete((void *)local_220._M_allocated_capacity,(ulong)(local_210._0_8_ + 1));
    }
    if ((string *)local_240._0_8_ != (string *)(local_240 + 0x10)) {
      operator_delete((void *)local_240._0_8_,local_240._16_8_ + 1);
    }
    local_1d0 = VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP;
    pIVar8 = (InstanceFactory<vkt::Draw::(anonymous_namespace)::IndirectDrawInstanced<vkt::Draw::(anonymous_namespace)::FirtsInstanceSupported>_>
              *)operator_new(0xa8);
    pTVar1 = pTVar2->m_testCtx;
    local_240._0_8_ = local_240 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_240,"triangle_strip","");
    local_220._M_allocated_capacity = (size_type)local_210;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_220,"Draws an instanced triangle strip","");
    std::
    _Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
    ::_Rb_tree((_Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
                *)&local_148,
               (_Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
                *)(local_210 + 0x10));
    local_148.super_TestSpecBase._52_4_ = iStack_1cc;
    local_148.super_TestSpecBase.topology = local_1d0;
    InstanceFactory<vkt::Draw::(anonymous_namespace)::IndirectDrawInstanced<vkt::Draw::(anonymous_namespace)::FirtsInstanceSupported>_>
    ::InstanceFactory(pIVar8,pTVar1,(string *)local_240._0_8_,
                      (string *)local_220._M_allocated_capacity,&local_148);
    tcu::TestNode::addChild(pTVar4,(TestNode *)pIVar8);
    std::
    _Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
    ::~_Rb_tree((_Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
                 *)&local_148);
    this = (IndirectDrawTests *)local_1c0;
    if ((string *)local_220._M_allocated_capacity != (string *)local_210) {
      operator_delete((void *)local_220._M_allocated_capacity,(ulong)(local_210._0_8_ + 1));
    }
    if ((string *)local_240._0_8_ != (string *)(local_240 + 0x10)) {
      operator_delete((void *)local_240._0_8_,local_240._16_8_ + 1);
    }
    std::
    _Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
    ::~_Rb_tree((_Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
                 *)(local_210 + 0x10));
    tcu::TestNode::addChild(local_1b0,pTVar4);
    tcu::TestNode::addChild(local_1b8,local_1b0);
    tcu::TestNode::addChild((TestNode *)this,local_1b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
      operator_delete(local_1a0._M_dataplus._M_p,
                      CONCAT71(local_1a0.field_2._M_allocated_capacity._1_7_,
                               local_1a0.field_2._M_local_buf[0]) + 1);
    }
    local_1c4 = 1;
    uVar9 = 0;
  } while ((local_1a4 & 1) != 0);
  return 0;
}

Assistant:

void IndirectDrawTests::init (void)
{
	for (int drawTypeIdx = 0; drawTypeIdx < DRAWTYPE_LAST; drawTypeIdx++)
	{
		std::string drawTypeStr;
		switch (drawTypeIdx)
		{
			case DRAW_TYPE_SEQUENTIAL:
				drawTypeStr = "sequential";
				break;
			case DRAW_TYPE_INDEXED:
				drawTypeStr = "indexed";
				break;
			default:
				TCU_FAIL("impossible");
		}

		tcu::TestCaseGroup* drawTypeGroup = new tcu::TestCaseGroup(m_testCtx, drawTypeStr.c_str(), ("Draws geometry using " + drawTypeStr + "draw call").c_str());
		{
			tcu::TestCaseGroup* indirectDrawGroup = new tcu::TestCaseGroup(m_testCtx, "indirect_draw", "Draws geometry");
			{
				IndirectDraw::TestSpec testSpec;
				testSpec.drawType = static_cast<DrawType>(drawTypeIdx);
				testSpec.shaders[glu::SHADERTYPE_VERTEX] = "vulkan/draw/VertexFetch.vert";
				testSpec.shaders[glu::SHADERTYPE_FRAGMENT] = "vulkan/draw/VertexFetch.frag";
				testSpec.topology = vk::VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST;
				indirectDrawGroup->addChild(new InstanceFactory<IndirectDraw>(m_testCtx, "triangle_list", "Draws triangle list", testSpec));
				testSpec.topology = vk::VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP;
				indirectDrawGroup->addChild(new InstanceFactory<IndirectDraw>(m_testCtx, "triangle_strip", "Draws triangle strip", testSpec));
			}
			drawTypeGroup->addChild(indirectDrawGroup);


			tcu::TestCaseGroup* indirectDrawInstancedGroup = new tcu::TestCaseGroup(m_testCtx, "indirect_draw_instanced", "Draws an instanced geometry");
			{
				tcu::TestCaseGroup*	noFirstInstanceGroup = new tcu::TestCaseGroup(m_testCtx, "no_first_instance", "Use 0 as firstInstance");
				{
					IndirectDrawInstanced<FirtsInstanceNotSupported>::TestSpec testSpec;
					testSpec.drawType = static_cast<DrawType>(drawTypeIdx);

					testSpec.shaders[glu::SHADERTYPE_VERTEX] = "vulkan/draw/VertexFetchInstanced.vert";
					testSpec.shaders[glu::SHADERTYPE_FRAGMENT] = "vulkan/draw/VertexFetch.frag";

					testSpec.topology = vk::VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST;
					noFirstInstanceGroup->addChild(new InstanceFactory<IndirectDrawInstanced<FirtsInstanceNotSupported> >(m_testCtx, "triangle_list", "Draws an instanced triangle list", testSpec));
					testSpec.topology = vk::VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP;
					noFirstInstanceGroup->addChild(new InstanceFactory<IndirectDrawInstanced<FirtsInstanceNotSupported> >(m_testCtx, "triangle_strip", "Draws an instanced triangle strip", testSpec));
				}
				indirectDrawInstancedGroup->addChild(noFirstInstanceGroup);

				tcu::TestCaseGroup*	firstInstanceGroup = new tcu::TestCaseGroup(m_testCtx, "first_instance", "Use drawIndirectFirstInstance optional feature");
				{
					IndirectDrawInstanced<FirtsInstanceSupported>::TestSpec testSpec;
					testSpec.drawType = static_cast<DrawType>(drawTypeIdx);

					testSpec.shaders[glu::SHADERTYPE_VERTEX] = "vulkan/draw/VertexFetchInstancedFirstInstance.vert";
					testSpec.shaders[glu::SHADERTYPE_FRAGMENT] = "vulkan/draw/VertexFetch.frag";

					testSpec.topology = vk::VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST;
					firstInstanceGroup->addChild(new InstanceFactory<IndirectDrawInstanced<FirtsInstanceSupported> >(m_testCtx, "triangle_list", "Draws an instanced triangle list", testSpec));
					testSpec.topology = vk::VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP;
					firstInstanceGroup->addChild(new InstanceFactory<IndirectDrawInstanced<FirtsInstanceSupported> >(m_testCtx, "triangle_strip", "Draws an instanced triangle strip", testSpec));
				}
				indirectDrawInstancedGroup->addChild(firstInstanceGroup);
			}
			drawTypeGroup->addChild(indirectDrawInstancedGroup);
		}

		addChild(drawTypeGroup);
	}
}